

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O0

void __thiscall cmQtAutoGeneratorRcc::PollStage(cmQtAutoGeneratorRcc *this)

{
  bool bVar1;
  uv_handle_ptr_base_<uv_async_s> *this_00;
  cmQtAutoGeneratorRcc *this_local;
  
  switch(this->Stage_) {
  case SETTINGS_READ:
    bVar1 = SettingsFileRead(this);
    if (bVar1) {
      SetStage(this,TEST_QRC_RCC_FILES);
    }
    else {
      SetStage(this,FINISH);
    }
    break;
  case TEST_QRC_RCC_FILES:
    bVar1 = TestQrcRccFiles(this);
    if (bVar1) {
      SetStage(this,GENERATE);
    }
    else {
      SetStage(this,TEST_RESOURCES_READ);
    }
    break;
  case TEST_RESOURCES_READ:
    bVar1 = TestResourcesRead(this);
    if (bVar1) {
      SetStage(this,TEST_RESOURCES);
    }
    break;
  case TEST_RESOURCES:
    bVar1 = TestResources(this);
    if (bVar1) {
      SetStage(this,GENERATE);
    }
    else {
      SetStage(this,TEST_INFO_FILE);
    }
    break;
  case TEST_INFO_FILE:
    TestInfoFile(this);
    SetStage(this,GENERATE_WRAPPER);
    break;
  case GENERATE:
    GenerateParentDir(this);
    SetStage(this,GENERATE_RCC);
    break;
  case GENERATE_RCC:
    bVar1 = GenerateRcc(this);
    if (bVar1) {
      SetStage(this,GENERATE_WRAPPER);
    }
    break;
  case GENERATE_WRAPPER:
    GenerateWrapper(this);
    SetStage(this,SETTINGS_WRITE);
    break;
  case SETTINGS_WRITE:
    SettingsFileWrite(this);
    SetStage(this,FINISH);
    break;
  case FINISH:
    this_00 = (uv_handle_ptr_base_<uv_async_s> *)
              cmQtAutoGenerator::UVRequest(&this->super_cmQtAutoGenerator);
    ::cm::uv_handle_ptr_base_<uv_async_s>::reset(this_00);
    this->Stage_ = END;
    break;
  case END:
  }
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::PollStage()
{
  switch (Stage_) {
    // -- Initialize
    case StageT::SETTINGS_READ:
      if (SettingsFileRead()) {
        SetStage(StageT::TEST_QRC_RCC_FILES);
      } else {
        SetStage(StageT::FINISH);
      }
      break;

    // -- Change detection
    case StageT::TEST_QRC_RCC_FILES:
      if (TestQrcRccFiles()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_RESOURCES_READ);
      }
      break;
    case StageT::TEST_RESOURCES_READ:
      if (TestResourcesRead()) {
        SetStage(StageT::TEST_RESOURCES);
      }
      break;
    case StageT::TEST_RESOURCES:
      if (TestResources()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_INFO_FILE);
      }
      break;
    case StageT::TEST_INFO_FILE:
      TestInfoFile();
      SetStage(StageT::GENERATE_WRAPPER);
      break;

    // -- Generation
    case StageT::GENERATE:
      GenerateParentDir();
      SetStage(StageT::GENERATE_RCC);
      break;
    case StageT::GENERATE_RCC:
      if (GenerateRcc()) {
        SetStage(StageT::GENERATE_WRAPPER);
      }
      break;
    case StageT::GENERATE_WRAPPER:
      GenerateWrapper();
      SetStage(StageT::SETTINGS_WRITE);
      break;

    // -- Finalize
    case StageT::SETTINGS_WRITE:
      SettingsFileWrite();
      SetStage(StageT::FINISH);
      break;
    case StageT::FINISH:
      // Clear all libuv handles
      UVRequest().reset();
      // Set highest END stage manually
      Stage_ = StageT::END;
      break;
    case StageT::END:
      break;
  }
}